

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.tpl.h
# Opt level: O3

Code * __thiscall
r_exec::Mem<r_exec::LObject,_r_exec::MemStatic>::build_object
          (Mem<r_exec::LObject,_r_exec::MemStatic> *this,Atom *head)

{
  vector<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
  *pvVar1;
  Code *pCVar2;
  char cVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  Code *this_00;
  undefined4 extraout_var;
  Atom *pAVar7;
  short sVar8;
  short sVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  
  pAVar7 = head;
  cVar3 = r_code::Atom::getDescriptor();
  if (cVar3 == -0x38) {
    this_00 = (Code *)operator_new(0x448);
    r_exec::Group::Group((Group *)this_00,(Mem *)0x0);
  }
  else {
    uVar5 = r_code::Atom::asOpcode();
    sVar4 = (short)uVar5;
    if (sVar4 == (short)Opcodes::Fact) {
      this_00 = (Code *)r_exec::Fact::operator_new((Fact *)0x150,(ulong)pAVar7);
      r_exec::Fact::Fact((Fact *)this_00);
    }
    else if (sVar4 == (short)Opcodes::AntiFact) {
      this_00 = (Code *)r_exec::AntiFact::operator_new((AntiFact *)0x150,(ulong)pAVar7);
      r_exec::AntiFact::AntiFact((AntiFact *)this_00);
    }
    else if (sVar4 == (short)Opcodes::Pred) {
      this_00 = (Code *)operator_new(0x180);
      r_exec::Pred::Pred((Pred *)this_00);
    }
    else if (sVar4 == (short)Opcodes::Goal) {
      this_00 = (Code *)operator_new(0x160);
      r_exec::Goal::Goal((Goal *)this_00);
    }
    else if (sVar4 == (short)Opcodes::ICst) {
      this_00 = (Code *)operator_new(0x170);
      r_exec::ICST::ICST((ICST *)this_00);
    }
    else if (sVar4 == (short)Opcodes::MkRdx) {
      this_00 = (Code *)operator_new(0x158);
      r_exec::MkRdx::MkRdx((MkRdx *)this_00);
    }
    else {
      auVar9 = pshuflw(ZEXT416(uVar5),ZEXT416(uVar5),0);
      sVar8 = auVar9._0_2_;
      auVar11._0_2_ = -(ushort)((short)Opcodes::MkActChg == sVar8);
      sVar10 = auVar9._2_2_;
      auVar11._2_2_ = -(ushort)((short)Opcodes::MkHighAct == sVar10);
      auVar11._4_2_ = -(ushort)((short)Opcodes::MkHighSln == sVar8);
      auVar11._6_2_ = -(ushort)((short)Opcodes::MkLowAct == sVar10);
      auVar11._8_2_ = -(ushort)((short)Opcodes::MkLowRes == sVar8);
      auVar11._10_2_ = -(ushort)((short)Opcodes::MkLowSln == sVar10);
      auVar11._12_2_ = -(ushort)((short)Opcodes::MkNew == sVar8);
      auVar11._14_2_ = -(ushort)((short)Opcodes::MkSlnChg == sVar10);
      if ((((((((((((((((((auVar11 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar11 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar11 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar11 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar11 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar11 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar11 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar11 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar11 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar11 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar11 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar11 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar11 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar11 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar11._14_2_ >> 7 & 1) == 0) && (auVar11._14_2_ & 0x8000) == 0) &&
          (sVar4 != (short)Opcodes::Success)) && (sVar4 != (short)Opcodes::Perf)) {
        this_00 = (Code *)operator_new(0x150);
        r_code::Code::Code(this_00);
        *(undefined1 (*) [16])
         &this_00[1].markers.cells.
          super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
        pvVar1 = &this_00[1].markers.cells;
        (pvVar1->
        super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar1->
        super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined1 (*) [16])&this_00[1].super__Object.refCount = (undefined1  [16])0x0;
        this_00[1].markers.used_cells_tail = 0;
        this_00[1].markers.free_cells = 0;
        this_00[1].markers.used_cell_count = 0;
        this_00[1].markers.free_cell_count = 0;
        this_00[1].views._M_h._M_buckets = (__buckets_ptr)0x0;
        this_00[1].views._M_h._M_bucket_count = 0;
        this_00[1].views._M_h._M_before_begin = (_Hash_node_base *)0x0;
        this_00[1].views._M_h._M_element_count = 0;
        pCVar2 = this_00 + 1;
        (pCVar2->views)._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        *(undefined4 *)&(pCVar2->views)._M_h._M_rehash_policy.field_0x4 = 0;
        (pCVar2->views)._M_h._M_rehash_policy._M_next_resize = 0;
        *(undefined1 (*) [16])&this_00[1].views._M_h._M_single_bucket = (undefined1  [16])0x0;
        *(undefined1 (*) [16])&this_00[2].super__Object.refCount = (undefined1  [16])0x0;
        pvVar1 = &this_00[2].markers.cells;
        (pvVar1->
        super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar1->
        super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        this_00[2].markers.cells.
        super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_00[1].super__Object._vptr__Object = (_func_int **)0xffffffff;
        (this_00->super__Object)._vptr__Object = (_func_int **)&PTR__Object_0011c7a0;
      }
      else {
        this_00 = (Code *)operator_new(200);
        r_code::Code::Code(this_00);
        (this_00->super__Object)._vptr__Object = (_func_int **)&PTR__LObject_0011c9d0;
        *(undefined1 (*) [16])&this_00[1].super__Object.refCount = (undefined1  [16])0x0;
        pvVar1 = &this_00[1].markers.cells;
        (pvVar1->
        super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar1->
        super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined1 (*) [16])
         &this_00[1].markers.cells.
          super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      }
    }
  }
  iVar6 = (*(this_00->super__Object)._vptr__Object[4])(this_00,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar6),head);
  return this_00;
}

Assistant:

r_code::Code *Mem<O, S>::build_object(Atom head) const
{
    r_code::Code *object;

    switch (head.getDescriptor()) {
    case Atom::GROUP:
        object = new Group();
        break;

    default: {
        uint16_t opcode = head.asOpcode();

        if (opcode == Opcodes::Fact) {
            object = new Fact();
        } else if (opcode == Opcodes::AntiFact) {
            object = new AntiFact();
        } else if (opcode == Opcodes::Pred) {
            object = new Pred();
        } else if (opcode == Opcodes::Goal) {
            object = new Goal();
        } else if (opcode == Opcodes::ICst) {
            object = new ICST();
        } else if (opcode == Opcodes::MkRdx) {
            object = new MkRdx();
        } else if (opcode == Opcodes::MkActChg ||
                   opcode == Opcodes::MkHighAct ||
                   opcode == Opcodes::MkHighSln ||
                   opcode == Opcodes::MkLowAct ||
                   opcode == Opcodes::MkLowRes ||
                   opcode == Opcodes::MkLowSln ||
                   opcode == Opcodes::MkNew ||
                   opcode == Opcodes::MkSlnChg ||
                   opcode == Opcodes::Success ||
                   opcode == Opcodes::Perf) {
            object = new r_code::LObject();
        } else if (O::RequiresPacking()) {
            object = new r_code::LObject();    // temporary sand box for assembling code; will be packed into an O at injection time.
        } else {
            object = new O();
        }

        break;
    }
    }

    object->code(0) = head;
    return object;
}